

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t verify_global_checksums(archive_read *a)

{
  wchar_t wVar1;
  archive_read *a_local;
  
  wVar1 = verify_checksums(a);
  return wVar1;
}

Assistant:

static int verify_global_checksums(struct archive_read* a) {
	return verify_checksums(a);
}